

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

size_t __thiscall google::protobuf::Reflection::SpaceUsedLong(Reflection *this,Message *message)

{
  ReflectionSchema *this_00;
  FieldDescriptor *this_01;
  byte bVar1;
  uint uVar2;
  Descriptor *pDVar3;
  FieldDescriptor *pFVar4;
  Nonnull<const_CordRep_*> pCVar5;
  int iVar6;
  uint32_t uVar7;
  CppStringType CVar8;
  UnknownFieldSet *this_02;
  size_t sVar9;
  size_t sVar10;
  RepeatedField<int> *pRVar11;
  Cord **ppCVar12;
  Message **ppMVar13;
  string *str;
  MapFieldBase *this_03;
  RepeatedField<bool> *pRVar14;
  RepeatedField<unsigned_long> *pRVar15;
  RepeatedField<absl::lts_20250127::Cord> *this_04;
  RepeatedPtrFieldBase *pRVar16;
  ArenaStringPtr *pAVar17;
  Cord *pCVar18;
  Nonnull<const_char_*> pcVar19;
  bool bVar20;
  int iVar21;
  OneofDescriptor *oneof_descriptor;
  long lVar22;
  long lVar23;
  long v1;
  Metadata MVar24;
  
  MVar24 = Message::GetMetadata(message);
  if (MVar24.reflection != this) {
    pDVar3 = this->descriptor_;
    MVar24 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError
              (pDVar3,MVar24.descriptor,(FieldDescriptor *)0x0,"SpaceUsedLong");
  }
  this_00 = &this->schema_;
  uVar2 = (this->schema_).object_size_;
  this_02 = GetUnknownFields(this,message);
  sVar9 = UnknownFieldSet::SpaceUsedExcludingSelfLong(this_02);
  sVar9 = sVar9 + uVar2;
  if ((this->schema_).extensions_offset_ != -1) {
    uVar7 = internal::ReflectionSchema::GetExtensionSetOffset(this_00);
    sVar10 = internal::ExtensionSet::SpaceUsedExcludingSelfLong
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar7));
    sVar9 = sVar9 + sVar10;
  }
  if (-1 < this->last_non_weak_field_index_) {
    v1 = -1;
    lVar22 = 0;
    do {
      v1 = v1 + 1;
      pDVar3 = this->descriptor_;
      lVar23 = (long)pDVar3->field_count_;
      if (v1 < lVar23) {
        pcVar19 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar19 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            (v1,lVar23,"index < field_count()");
      }
      if (pcVar19 != (Nonnull<const_char_*>)0x0) {
LAB_001ee2a6:
        SpaceUsedLong();
LAB_001ee2b3:
        internal::protobuf_assumption_failed
                  ("res != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb31);
      }
      pFVar4 = pDVar3->fields_;
      bVar1 = (&pFVar4->field_0x1)[lVar22];
      bVar20 = (bool)((bVar1 & 0x20) >> 5);
      if (0xbf < bVar1 == bVar20) {
        pcVar19 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar19 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                            (bVar20,0xbf < bVar1,
                             "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      }
      if (pcVar19 != (Nonnull<const_char_*>)0x0) {
        SpaceUsedLong();
        goto LAB_001ee2a6;
      }
      this_01 = (FieldDescriptor *)(&pFVar4->super_SymbolBase + lVar22);
      if ((this_01->field_0x1 & 0x20) == 0) {
        bVar20 = internal::ReflectionSchema::InRealOneof(this_00,this_01);
        if (bVar20) {
          if ((this_01->field_0x1 & 0x10) == 0) {
            oneof_descriptor = (OneofDescriptor *)0x0;
          }
          else {
            oneof_descriptor = *(OneofDescriptor **)((long)&pFVar4->scope_ + lVar22);
            if (oneof_descriptor == (OneofDescriptor *)0x0) goto LAB_001ee2b3;
          }
          uVar7 = GetOneofCase(this,message,oneof_descriptor);
          if (uVar7 != *(uint32_t *)((long)&pFVar4->number_ + lVar22))
          goto switchD_001edf23_default;
        }
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(&pFVar4->type_)[lVar22] * 4) == 10
           ) {
          if (this_00->default_instance_ != message) {
            ppMVar13 = GetRaw<google::protobuf::Message_const*>(this,message,this_01);
            if (*ppMVar13 != (Message *)0x0) {
              sVar10 = Message::SpaceUsedLong(*ppMVar13);
              goto LAB_001ee15e;
            }
          }
        }
        else if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(&pFVar4->type_)[lVar22] * 4)
                 == 9) {
          CVar8 = FieldDescriptor::cpp_string_type(this_01);
          if ((CVar8 == kView) || (CVar8 == kString)) {
            bVar20 = internal::ReflectionSchema::IsFieldInlined(this_00,this_01);
            if (bVar20) {
              str = (string *)
                    GetRaw<google::protobuf::internal::InlinedStringField>(this,message,this_01);
              sVar10 = internal::StringSpaceUsedExcludingSelfLong(str);
              goto LAB_001ee15e;
            }
            pAVar17 = GetRaw<google::protobuf::internal::ArenaStringPtr>(this,message,this_01);
            if ((((ulong)(pAVar17->tagged_ptr_).ptr_ & 3) != 0) ||
               (bVar20 = internal::ReflectionSchema::InRealOneof(this_00,this_01), bVar20)) {
              sVar10 = internal::StringSpaceUsedExcludingSelfLong
                                 ((string *)
                                  ((ulong)(pAVar17->tagged_ptr_).ptr_ & 0xfffffffffffffffc));
              sVar9 = sVar9 + sVar10 + 0x20;
            }
          }
          else if (CVar8 == kCord) {
            bVar20 = internal::ReflectionSchema::InRealOneof(this_00,this_01);
            if (bVar20) {
              ppCVar12 = GetRaw<absl::lts_20250127::Cord*>(this,message,this_01);
              pCVar5 = ((*ppCVar12)->contents_).data_.rep_.field_0.as_tree.rep;
              sVar10 = 0x10;
              if (pCVar5 != (Nonnull<const_CordRep_*>)0x0 &&
                  (((*ppCVar12)->contents_).data_.rep_.field_0.data[0] & 1U) != 0) {
                sVar10 = absl::lts_20250127::cord_internal::GetEstimatedMemoryUsage(pCVar5);
                sVar10 = sVar10 + 0x10;
              }
            }
            else {
              pCVar18 = GetRaw<absl::lts_20250127::Cord>(this,message,this_01);
              pCVar5 = (pCVar18->contents_).data_.rep_.field_0.as_tree.rep;
              if (pCVar5 == (Nonnull<const_CordRep_*>)0x0 ||
                  ((pCVar18->contents_).data_.rep_.field_0.data[0] & 1U) == 0) {
                sVar10 = 0;
              }
              else {
                sVar10 = absl::lts_20250127::cord_internal::GetEstimatedMemoryUsage(pCVar5);
              }
            }
            goto LAB_001ee15e;
          }
        }
        goto switchD_001edf23_default;
      }
      switch(*(undefined4 *)
              (FieldDescriptor::kTypeToCppTypeMap + (ulong)(&pFVar4->type_)[lVar22] * 4)) {
      case 1:
      case 8:
        pRVar11 = GetRaw<google::protobuf::RepeatedField<int>>(this,message,this_01);
        break;
      case 2:
        pRVar15 = (RepeatedField<unsigned_long> *)
                  GetRaw<google::protobuf::RepeatedField<long>>(this,message,this_01);
        goto LAB_001ee10d;
      case 3:
        pRVar11 = (RepeatedField<int> *)
                  GetRaw<google::protobuf::RepeatedField<unsigned_int>>(this,message,this_01);
        break;
      case 4:
        pRVar15 = GetRaw<google::protobuf::RepeatedField<unsigned_long>>(this,message,this_01);
        goto LAB_001ee10d;
      case 5:
        pRVar15 = (RepeatedField<unsigned_long> *)
                  GetRaw<google::protobuf::RepeatedField<double>>(this,message,this_01);
LAB_001ee10d:
        iVar21 = 1;
        if ((undefined1  [16])
            ((undefined1  [16])(pRVar15->soo_rep_).field_0 & (undefined1  [16])0x4) !=
            (undefined1  [16])0x0) {
          iVar21 = (pRVar15->soo_rep_).field_0.long_rep.capacity;
        }
        bVar20 = SBORROW4(iVar21,2);
        iVar6 = iVar21 + -2;
        lVar23 = (long)iVar21 * 8;
        goto LAB_001ee155;
      case 6:
        pRVar11 = (RepeatedField<int> *)
                  GetRaw<google::protobuf::RepeatedField<float>>(this,message,this_01);
        break;
      case 7:
        pRVar14 = GetRaw<google::protobuf::RepeatedField<bool>>(this,message,this_01);
        iVar21 = 3;
        if ((undefined1  [16])
            ((undefined1  [16])(pRVar14->soo_rep_).field_0 & (undefined1  [16])0x4) !=
            (undefined1  [16])0x0) {
          iVar21 = (pRVar14->soo_rep_).field_0.long_rep.capacity;
        }
        lVar23 = (long)iVar21 + 8;
        if (iVar21 < 4) {
          lVar23 = 0;
        }
        sVar9 = sVar9 + lVar23;
        goto switchD_001edf23_default;
      case 9:
        CVar8 = FieldDescriptor::cpp_string_type(this_01);
        if ((CVar8 == kView) || (CVar8 == kString)) {
          pRVar16 = &GetRaw<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                               (this,message,this_01)->super_RepeatedPtrFieldBase;
          sVar10 = internal::RepeatedPtrFieldBase::
                   SpaceUsedExcludingSelfLong<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                             (pRVar16);
        }
        else {
          if (CVar8 != kCord) goto switchD_001edf23_default;
          this_04 = GetRaw<google::protobuf::RepeatedField<absl::lts_20250127::Cord>>
                              (this,message,this_01);
          sVar10 = RepeatedField<absl::lts_20250127::Cord>::SpaceUsedExcludingSelfLong(this_04);
        }
        goto LAB_001ee15e;
      case 10:
        if (((&pFVar4->type_)[lVar22] == 0xb) &&
           (bVar20 = FieldDescriptor::is_map_message_type(this_01), bVar20)) {
          this_03 = GetRaw<google::protobuf::internal::MapFieldBase>(this,message,this_01);
          sVar10 = internal::MapFieldBase::SpaceUsedExcludingSelfLong(this_03);
        }
        else {
          pRVar16 = GetRaw<google::protobuf::internal::RepeatedPtrFieldBase>(this,message,this_01);
          sVar10 = internal::RepeatedPtrFieldBase::
                   SpaceUsedExcludingSelfLong<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                             (pRVar16);
        }
        goto LAB_001ee15e;
      default:
        goto switchD_001edf23_default;
      }
      iVar21 = 2;
      if ((undefined1  [16])((undefined1  [16])(pRVar11->soo_rep_).field_0 & (undefined1  [16])0x4)
          != (undefined1  [16])0x0) {
        iVar21 = (pRVar11->soo_rep_).field_0.long_rep.capacity;
      }
      bVar20 = SBORROW4(iVar21,3);
      iVar6 = iVar21 + -3;
      lVar23 = (long)iVar21 * 4;
LAB_001ee155:
      sVar10 = lVar23 + 8;
      if (bVar20 != iVar6 < 0) {
        sVar10 = 0;
      }
LAB_001ee15e:
      sVar9 = sVar9 + sVar10;
switchD_001edf23_default:
      lVar22 = lVar22 + 0x58;
    } while (v1 < this->last_non_weak_field_index_);
  }
  return sVar9;
}

Assistant:

size_t Reflection::SpaceUsedLong(const Message& message) const {
  STATIC_USAGE_CHECK_MESSAGE(SpaceUsedLong, &message);
  // object_size_ already includes the in-memory representation of each field
  // in the message, so we only need to account for additional memory used by
  // the fields.
  size_t total_size = schema_.GetObjectSize();

  total_size += GetUnknownFields(message).SpaceUsedExcludingSelfLong();

  if (schema_.HasExtensionSet()) {
    total_size += GetExtensionSet(message).SpaceUsedExcludingSelfLong();
  }
  for (int i = 0; i <= last_non_weak_field_index_; i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (field->is_repeated()) {
      switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                           \
  case FieldDescriptor::CPPTYPE_##UPPERCASE:                        \
    total_size += GetRaw<RepeatedField<LOWERCASE> >(message, field) \
                      .SpaceUsedExcludingSelfLong();                \
    break

        HANDLE_TYPE(INT32, int32_t);
        HANDLE_TYPE(INT64, int64_t);
        HANDLE_TYPE(UINT32, uint32_t);
        HANDLE_TYPE(UINT64, uint64_t);
        HANDLE_TYPE(DOUBLE, double);
        HANDLE_TYPE(FLOAT, float);
        HANDLE_TYPE(BOOL, bool);
        HANDLE_TYPE(ENUM, int);
#undef HANDLE_TYPE

        case FieldDescriptor::CPPTYPE_STRING:
          switch (field->cpp_string_type()) {
            case FieldDescriptor::CppStringType::kCord:
              total_size += GetRaw<RepeatedField<absl::Cord>>(message, field)
                                .SpaceUsedExcludingSelfLong();
              break;
            case FieldDescriptor::CppStringType::kView:
            case FieldDescriptor::CppStringType::kString:
              total_size +=
                  GetRaw<RepeatedPtrField<std::string> >(message, field)
                      .SpaceUsedExcludingSelfLong();
              break;
          }
          break;

        case FieldDescriptor::CPPTYPE_MESSAGE:
          if (IsMapFieldInApi(field)) {
            total_size += GetRaw<internal::MapFieldBase>(message, field)
                              .SpaceUsedExcludingSelfLong();
          } else {
            // We don't know which subclass of RepeatedPtrFieldBase the type is,
            // so we use RepeatedPtrFieldBase directly.
            total_size +=
                GetRaw<RepeatedPtrFieldBase>(message, field)
                    .SpaceUsedExcludingSelfLong<GenericTypeHandler<Message> >();
          }

          break;
      }
    } else {
      if (schema_.InRealOneof(field) && !HasOneofField(message, field)) {
        continue;
      }
      switch (field->cpp_type()) {
        case FieldDescriptor::CPPTYPE_INT32:
        case FieldDescriptor::CPPTYPE_INT64:
        case FieldDescriptor::CPPTYPE_UINT32:
        case FieldDescriptor::CPPTYPE_UINT64:
        case FieldDescriptor::CPPTYPE_DOUBLE:
        case FieldDescriptor::CPPTYPE_FLOAT:
        case FieldDescriptor::CPPTYPE_BOOL:
        case FieldDescriptor::CPPTYPE_ENUM:
          // Field is inline, so we've already counted it.
          break;

        case FieldDescriptor::CPPTYPE_STRING: {
          switch (field->cpp_string_type()) {
            case FieldDescriptor::CppStringType::kCord:
              if (schema_.InRealOneof(field)) {
                total_size += GetField<absl::Cord*>(message, field)
                                  ->EstimatedMemoryUsage();

              } else {
                // sizeof(absl::Cord) is included to self.
                total_size += GetField<absl::Cord>(message, field)
                                  .EstimatedMemoryUsage() -
                              sizeof(absl::Cord);
              }
              break;
            case FieldDescriptor::CppStringType::kView:
            case FieldDescriptor::CppStringType::kString:
              if (IsInlined(field)) {
                const std::string* ptr =
                    &GetField<InlinedStringField>(message, field).GetNoArena();
                total_size += StringSpaceUsedExcludingSelfLong(*ptr);
              } else if (IsMicroString(field)) {
                total_size += GetField<MicroString>(message, field)
                                  .SpaceUsedExcludingSelfLong();
              } else {
                // Initially, the string points to the default value stored
                // in the prototype. Only count the string if it has been
                // changed from the default value.
                // Except oneof fields, those never point to a default instance,
                // and there is no default instance to point to.
                const auto& str = GetField<ArenaStringPtr>(message, field);
                if (!str.IsDefault() || schema_.InRealOneof(field)) {
                  // string fields are represented by just a pointer, so also
                  // include sizeof(string) as well.
                  total_size += sizeof(std::string) +
                                StringSpaceUsedExcludingSelfLong(str.Get());
                }
              }
              break;
          }
          break;
        }

        case FieldDescriptor::CPPTYPE_MESSAGE:
          if (schema_.IsDefaultInstance(message)) {
            // For singular fields, the prototype just stores a pointer to the
            // external type's prototype, so there is no extra memory usage.
          } else {
            const Message* sub_message = GetRaw<const Message*>(message, field);
            if (sub_message != nullptr) {
              total_size += sub_message->SpaceUsedLong();
            }
          }
          break;
      }
    }
  }
  if (internal::DebugHardenFuzzMessageSpaceUsedLong()) {
    // Use both `this` and `dummy` to generate the seed so that the scale factor
    // is both per-object and non-predictable, but consistent across multiple
    // calls in the same binary.
    static bool dummy;
    uintptr_t seed =
        reinterpret_cast<uintptr_t>(&dummy) ^ reinterpret_cast<uintptr_t>(this);
    // Fuzz the size by +/- 50%.
    double scale = (static_cast<double>(seed % 10000) / 10000) + 0.5;
    return total_size * scale;
  } else {
    return total_size;
  }
}